

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::combineAnd(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_00;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_02;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_03;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_04;
  bool bVar2;
  BinaryOp op;
  Id IVar3;
  Module *wasm;
  Binary *pBVar4;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *in_RCX;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *s;
  Type *other;
  Match *this_00;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R8;
  bool local_371;
  bool local_359;
  bool local_341;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_330;
  Binary *local_2f0 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_2e0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_2a8;
  Binary *local_268 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_258;
  Const *local_220;
  Const *cy_1;
  Const *cx_1;
  Expression *y_2;
  Expression *x_2;
  Binary *by_1;
  Binary *bx_1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_1e8;
  Binary *local_1a8 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_198;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_160;
  Binary *local_120 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_110;
  Const *local_d8;
  Const *cy;
  Const *cx;
  Expression *y_1;
  Expression *x_1;
  Binary *by;
  Binary *bx;
  Builder local_a0;
  OptimizeInstructions *local_98;
  Unary *inner;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_80;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_60 [2];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_50;
  undefined1 local_30 [8];
  Expression *y;
  Expression *x;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  x = (Expression *)curr;
  curr_local = (Binary *)this;
  if (curr->op != AndInt32) {
    __assert_fail("curr->op == AndInt32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xc14,"Expression *wasm::OptimizeInstructions::combineAnd(Binary *)");
  }
  pEVar1 = curr->left;
  local_60[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,
                           (Expression **)curr);
  other = (Type *)0x13;
  Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_50,(Match *)0x13,(Op)local_60,in_RCX);
  matcher.data = local_50.data;
  matcher._12_4_ = local_50._12_4_;
  matcher.binder = local_50.binder;
  matcher.submatchers.curr = local_50.submatchers.curr;
  matcher.submatchers._8_8_ = local_50.submatchers._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                    (pEVar1,matcher);
  s = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
      CONCAT71((int7)((ulong)local_50.submatchers.curr >> 8),bVar2);
  local_341 = false;
  if (bVar2) {
    pEVar1 = *(Expression **)(x + 2);
    inner = (Unary *)Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                local_30,(Expression **)other);
    other = (Type *)0x13;
    Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_80,(Match *)0x13,(Op)&inner,s);
    matcher_00.data = local_80.data;
    matcher_00._12_4_ = local_80._12_4_;
    matcher_00.binder = local_80.binder;
    matcher_00.submatchers.curr = local_80.submatchers.curr;
    matcher_00.submatchers._8_8_ = local_80.submatchers._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      (pEVar1,matcher_00);
    local_341 = false;
    if (bVar2) {
      other = (Type *)((long)local_30 + 8);
      local_341 = wasm::Type::operator==(&y->type,other);
    }
  }
  if (local_341 == false) {
    pEVar1 = (Expression *)x[1].type.id;
    local_120[0] = (Binary *)
                   Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y_1,
                              (Expression **)other);
    Match::ival(&local_160,&cy);
    pBVar4 = (Binary *)&by;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_110,(Match *)pBVar4,local_120,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_160,in_R8);
    matcher_01._8_8_ = local_110._8_8_;
    matcher_01.binder = local_110.binder;
    matcher_01.submatchers.curr.binder = local_110.submatchers.curr.binder;
    matcher_01.submatchers.curr._8_8_ = local_110.submatchers.curr._8_8_;
    matcher_01.submatchers.next.curr = local_110.submatchers.next.curr;
    matcher_01.submatchers.next.next.curr = local_110.submatchers.next.next.curr;
    matcher_01.submatchers.next.next._8_8_ = local_110.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      (pEVar1,matcher_01);
    local_359 = false;
    if (bVar2) {
      pEVar1 = *(Expression **)(x + 2);
      local_1a8[0] = (Binary *)
                     Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&cx,
                                (Expression **)pBVar4);
      Match::ival(&local_1e8,&local_d8);
      pBVar4 = (Binary *)&x_1;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                (&local_198,(Match *)pBVar4,local_1a8,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_1e8,in_R8);
      matcher_02._8_8_ = local_198._8_8_;
      matcher_02.binder = local_198.binder;
      matcher_02.submatchers.curr.binder = local_198.submatchers.curr.binder;
      matcher_02.submatchers.curr._8_8_ = local_198.submatchers.curr._8_8_;
      matcher_02.submatchers.next.curr = local_198.submatchers.next.curr;
      matcher_02.submatchers.next.next.curr = local_198.submatchers.next.next.curr;
      matcher_02.submatchers.next.next._8_8_ = local_198.submatchers.next.next._8_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                        (pEVar1,matcher_02);
      local_359 = false;
      if ((bVar2) && (local_359 = false, by->op == x_1[1]._id)) {
        pBVar4 = (Binary *)
                 &(cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type;
        bVar2 = wasm::Type::operator==(&y_1->type,(Type *)pBVar4);
        local_359 = false;
        if (bVar2) {
          pBVar4 = (Binary *)&local_d8->value;
          bVar2 = wasm::Literal::operator==(&cy->value,(Literal *)pBVar4);
          local_359 = false;
          if (bVar2) {
            pBVar4 = by;
            local_359 = inversesAnd(this,by);
          }
        }
      }
    }
    if (local_359 == false) {
      pEVar1 = (Expression *)x[1].type.id;
      local_268[0] = (Binary *)
                     Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y_2
                                ,(Expression **)pBVar4);
      Match::ival(&local_2a8,&cy_1);
      this_00 = (Match *)&by_1;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                (&local_258,this_00,local_268,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_2a8,in_R8);
      matcher_03._8_8_ = local_258._8_8_;
      matcher_03.binder = local_258.binder;
      matcher_03.submatchers.curr.binder = local_258.submatchers.curr.binder;
      matcher_03.submatchers.curr._8_8_ = local_258.submatchers.curr._8_8_;
      matcher_03.submatchers.next.curr = local_258.submatchers.next.curr;
      matcher_03.submatchers.next.next.curr = local_258.submatchers.next.next.curr;
      matcher_03.submatchers.next.next._8_8_ = local_258.submatchers.next.next._8_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                        (pEVar1,matcher_03);
      local_371 = false;
      if (bVar2) {
        pEVar1 = *(Expression **)(x + 2);
        local_2f0[0] = (Binary *)
                       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                  &cx_1,(Expression **)this_00);
        Match::ival(&local_330,&local_220);
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                  (&local_2e0,(Match *)&x_2,local_2f0,
                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_330,in_R8)
        ;
        matcher_04._8_8_ = local_2e0._8_8_;
        matcher_04.binder = local_2e0.binder;
        matcher_04.submatchers.curr.binder = local_2e0.submatchers.curr.binder;
        matcher_04.submatchers.curr._8_8_ = local_2e0.submatchers.curr._8_8_;
        matcher_04.submatchers.next.curr = local_2e0.submatchers.next.curr;
        matcher_04.submatchers.next.next.curr = local_2e0.submatchers.next.next.curr;
        matcher_04.submatchers.next.next._8_8_ = local_2e0.submatchers.next.next._8_8_;
        bVar2 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                          (pEVar1,matcher_04);
        local_371 = false;
        if ((bVar2) && (local_371 = false, by_1->op == x_2[1]._id)) {
          bVar2 = wasm::Type::operator==
                            (&y_2->type,
                             &(cx_1->super_SpecificExpression<(wasm::Expression::Id)14>).
                              super_Expression.type);
          local_371 = false;
          if (bVar2) {
            bVar2 = wasm::Literal::operator==(&cy_1->value,&local_220->value);
            local_371 = false;
            if (bVar2) {
              local_371 = preserveAnd(this,by_1);
            }
          }
        }
      }
      if (local_371 == false) {
        this_local = (OptimizeInstructions *)0x0;
      }
      else {
        IVar3 = Abstract::getBinary((Type)(y_2->type).id,And);
        x_2[1]._id = IVar3;
        (x_2->type).id = (y_2->type).id;
        x_2[1].type.id = (uintptr_t)y_2;
        *(Const **)(x_2 + 2) = cx_1;
        by_1->left = x_2;
        this_local = (OptimizeInstructions *)by_1;
      }
    }
    else {
      bx_1 = (Binary *)(y_1->type).id;
      IVar3 = Abstract::getBinary((Type)bx_1,Or);
      x_1[1]._id = IVar3;
      (x_1->type).id = (y_1->type).id;
      x_1[1].type.id = (uintptr_t)y_1;
      *(Const **)(x_1 + 2) = cx;
      by->left = x_1;
      this_local = (OptimizeInstructions *)by;
    }
  }
  else {
    local_98 = (OptimizeInstructions *)Expression::cast<wasm::Unary>((Expression *)x[1].type.id);
    wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
    Builder::Builder(&local_a0,wasm);
    bx = (Binary *)(y->type).id;
    op = Abstract::getBinary((Type)bx,Or);
    pBVar4 = Builder::makeBinary(&local_a0,op,y,(Expression *)local_30);
    (local_98->
    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
    ).super_Pass.name._M_string_length = (size_type)pBVar4;
    this_local = local_98;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* combineAnd(Binary* curr) {
    assert(curr->op == AndInt32);

    using namespace Abstract;
    using namespace Match;

    {
      // (i32(x) == 0) & (i32(y) == 0)   ==>   i32(x | y) == 0
      // (i64(x) == 0) & (i64(y) == 0)   ==>   i64(x | y) == 0
      Expression *x, *y;
      if (matches(curr->left, unary(EqZ, any(&x))) &&
          matches(curr->right, unary(EqZ, any(&y))) && x->type == y->type) {
        auto* inner = curr->left->cast<Unary>();
        inner->value =
          Builder(*getModule()).makeBinary(getBinary(x->type, Or), x, y);
        return inner;
      }
    }
    {
      // Binary operations that inverse a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesAnd(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveAnd(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }